

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlNewEntityInputStream(void)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr val;
  xmlParserInputPtr val_00;
  int local_34;
  int n_ent;
  xmlEntityPtr ent;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (ent._4_4_ = 0; (int)ent._4_4_ < 3; ent._4_4_ = ent._4_4_ + 1) {
    for (local_34 = 0; local_34 < 1; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlParserCtxtPtr(ent._4_4_,0);
      val_00 = (xmlParserInputPtr)xmlNewEntityInputStream(val,0);
      desret_xmlParserInputPtr(val_00);
      call_tests = call_tests + 1;
      des_xmlParserCtxtPtr(ent._4_4_,val,0);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewEntityInputStream",(ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)ent._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlNewEntityInputStream(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserInputPtr ret_val;
    xmlParserCtxtPtr ctxt; /* an XML parser context */
    int n_ctxt;
    xmlEntityPtr ent; /* an Entity pointer */
    int n_ent;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_ent = 0;n_ent < gen_nb_xmlEntityPtr;n_ent++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        ent = gen_xmlEntityPtr(n_ent, 1);

        ret_val = xmlNewEntityInputStream(ctxt, ent);
        desret_xmlParserInputPtr(ret_val);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_xmlEntityPtr(n_ent, ent, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlNewEntityInputStream",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_ent);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}